

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O3

void llama_kv_cache_view_update(llama_kv_cache_view *view,llama_kv_cache *kv)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  llama_kv_cache_view_cell *plVar5;
  llama_seq_id *plVar6;
  _Rb_tree_node_base *p_Var7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  undefined8 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  _Rb_tree_node_base *p_Var17;
  ulong uVar18;
  int32_t local_5c;
  uint local_58;
  
  if ((kv == (llama_kv_cache *)0x0) ||
     (lVar4 = __dynamic_cast(kv,&llama_kv_cache::typeinfo,&llama_kv_cache_unified::typeinfo,0),
     lVar4 == 0)) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: the kv_cache_view currently works only with llama_kv_cache_unified\n",
                       "llama_kv_cache_view_update");
    return;
  }
  uVar2 = *(uint *)(lVar4 + 0x6c);
  plVar5 = view->cells;
  if (uVar2 <= (uint)view->n_cells) {
    if (plVar5 != (llama_kv_cache_view_cell *)0x0) goto LAB_001b2c1f;
    plVar5 = (llama_kv_cache_view_cell *)0x0;
  }
  view->n_cells = uVar2;
  plVar5 = (llama_kv_cache_view_cell *)realloc(plVar5,(long)(int)uVar2 << 2);
  if (plVar5 == (llama_kv_cache_view_cell *)0x0) {
    pcVar9 = "p != nullptr && \"Failed to alloc kv_cache_view cells\"";
    uVar11 = 0x52a;
  }
  else {
    view->cells = plVar5;
    plVar6 = (llama_seq_id *)
             realloc(view->cells_sequences,(long)view->n_cells * (long)view->n_seq_max * 4);
    if (plVar6 != (llama_seq_id *)0x0) {
      view->cells_sequences = plVar6;
      uVar2 = *(uint *)(lVar4 + 0x6c);
LAB_001b2c1f:
      if ((int)uVar2 < 1) {
        local_5c = -1;
        iVar12 = 0;
        iVar13 = 0;
        local_58 = 0;
      }
      else {
        plVar5 = view->cells;
        plVar6 = view->cells_sequences;
        lVar8 = *(long *)(lVar4 + 0x78);
        uVar10 = 0;
        local_5c = -1;
        local_58 = 0;
        uVar15 = 0xffffffff;
        iVar12 = 0;
        iVar13 = 0;
        do {
          lVar16 = uVar10 * 0x40;
          lVar1 = *(long *)(lVar8 + 0x38 + lVar16);
          plVar5->pos = *(int *)(lVar8 + 4 + lVar16) + *(int *)(lVar8 + lVar16);
          iVar14 = (int)uVar15;
          if (lVar1 == 0) {
            if (iVar14 < 0) {
              uVar15 = uVar10 & 0xffffffff;
            }
          }
          else {
            if ((-1 < iVar14) && (uVar2 = (int)uVar10 - iVar14, local_58 < uVar2)) {
              local_5c = iVar14;
              local_58 = uVar2;
            }
            uVar15 = 0xffffffff;
          }
          p_Var7 = *(_Rb_tree_node_base **)(lVar16 + lVar8 + 0x28);
          p_Var17 = (_Rb_tree_node_base *)(lVar16 + lVar8 + 0x18);
          iVar14 = (int)uVar15;
          if (p_Var7 == p_Var17) {
            uVar18 = 0;
          }
          else {
            uVar18 = 0;
            do {
              if ((long)view->n_seq_max <= (long)uVar18) break;
              plVar6[uVar18] = p_Var7[1]._M_color;
              uVar18 = uVar18 + 1;
              p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
            } while (p_Var7 != p_Var17);
          }
          iVar13 = (iVar13 + 1) - (uint)((int)uVar18 == 0);
          iVar3 = view->n_seq_max;
          if ((int)uVar18 < iVar3) {
            uVar18 = uVar18 & 0xffffffff;
            do {
              plVar6[uVar18] = -1;
              uVar18 = uVar18 + 1;
              iVar3 = view->n_seq_max;
            } while ((int)uVar18 < iVar3);
          }
          iVar12 = iVar12 + (int)lVar1;
          uVar10 = uVar10 + 1;
          plVar5 = plVar5 + 1;
          plVar6 = plVar6 + iVar3;
        } while ((long)uVar10 < (long)*(int *)(lVar4 + 0x6c));
        if ((-1 < iVar14) &&
           (lVar8 = *(long *)(lVar4 + 0x80) - *(long *)(lVar4 + 0x78) >> 6,
           (ulong)local_58 < lVar8 - uVar15)) {
          local_58 = (int)lVar8 - iVar14;
          local_5c = iVar14;
        }
      }
      view->max_contiguous = local_58;
      view->max_contiguous_idx = local_5c;
      view->token_count = iVar12;
      view->used_cells = iVar13;
      if (iVar13 == *(int *)(lVar4 + 0x70)) {
        return;
      }
      llama_log_internal(GGML_LOG_LEVEL_ERROR,
                         "%s: used cells mismatch. kv_cache says %d but we calculated %d\n",
                         "llama_kv_cache_view_update");
      return;
    }
    pcVar9 = "p != nullptr && \"Failed to alloc kv_cache_view cells sequences\"";
    uVar11 = 0x52d;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-kv-cache.cpp"
             ,uVar11,"GGML_ASSERT(%s) failed",pcVar9);
}

Assistant:

void llama_kv_cache_view_update(llama_kv_cache_view * view, const llama_kv_cache * kv) {
    // TODO: rework this in the future, for now quick hack
    const llama_kv_cache_unified * kvu = dynamic_cast<const llama_kv_cache_unified *>(kv);
    if (kvu == nullptr) {
        LLAMA_LOG_ERROR("%s: the kv_cache_view currently works only with llama_kv_cache_unified\n", __func__);
        return;
    }

    if (uint32_t(view->n_cells) < kvu->size || view->cells == nullptr) {
        view->n_cells = int32_t(kvu->size);
        void * p = realloc(view->cells, sizeof(llama_kv_cache_view_cell) * view->n_cells);
        GGML_ASSERT(p != nullptr && "Failed to alloc kv_cache_view cells");
        view->cells = (llama_kv_cache_view_cell *)p;
        p = realloc(view->cells_sequences, sizeof(llama_seq_id) * view->n_seq_max * view->n_cells);
        GGML_ASSERT(p != nullptr && "Failed to alloc kv_cache_view cells sequences");
        view->cells_sequences = (llama_seq_id *)p;
    }

    const std::vector<llama_kv_cell> & kv_cells = kvu->cells;
    llama_kv_cache_view_cell * c_curr = view->cells;
    llama_seq_id * cs_curr = view->cells_sequences;
    int32_t used_cells = 0;
    int32_t token_count = 0;
    int32_t curr_contig_idx = -1;
    uint32_t max_contig = 0;
    int32_t max_contig_idx = -1;

    for (int32_t i = 0; i < int32_t(kvu->size); i++, c_curr++, cs_curr += view->n_seq_max) {
        const size_t curr_size = kv_cells[i].seq_id.size();
        token_count += curr_size;
        c_curr->pos = kv_cells[i].pos + kv_cells[i].delta;

        if (curr_size > 0) {
            if (curr_contig_idx >= 0 && uint32_t(i - curr_contig_idx) > max_contig) {
                max_contig = i - curr_contig_idx;
                max_contig_idx = curr_contig_idx;
            }
            curr_contig_idx = -1;
        } else if (curr_contig_idx < 0) {
            curr_contig_idx = i;
        }

        int seq_idx = 0;
        for (const llama_seq_id it : kv_cells[i].seq_id) {
            if (seq_idx >= view->n_seq_max) {
                break;
            }
            cs_curr[seq_idx] = it;
            seq_idx++;
        }
        if (seq_idx != 0) {
            used_cells++;
        }
        for (; seq_idx < view->n_seq_max; seq_idx++) {
            cs_curr[seq_idx] = -1;
        }
    }
    if (curr_contig_idx >= 0 && kv_cells.size() - curr_contig_idx > max_contig) {
        max_contig_idx = curr_contig_idx;
        max_contig = kv_cells.size() - curr_contig_idx;
    }
    view->max_contiguous = max_contig;
    view->max_contiguous_idx = max_contig_idx;
    view->token_count = token_count;
    view->used_cells = used_cells;
    if (uint32_t(used_cells) != kvu->used) {
        LLAMA_LOG_ERROR("%s: used cells mismatch. kv_cache says %d but we calculated %d\n",
            __func__, kvu->used, used_cells);
    }
}